

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetailedFormatter.h
# Opt level: O0

DetailedFormatter * __thiscall
SLogLib::DetailedFormatter::formatMessage_abi_cxx11_(DetailedFormatter *this,Message *msg)

{
  undefined8 uVar1;
  type tVar2;
  reference pvVar3;
  ostream *poVar4;
  size_type sVar5;
  string *in_RDX;
  undefined1 local_248 [8];
  CallInfo _callInfo1;
  size_t i;
  ostringstream local_1e8 [8];
  ostringstream _stream;
  undefined1 local_70 [8];
  CallInfo _callInfo;
  size_t _size;
  Message *msg_local;
  DetailedFormatter *this_local;
  
  _callInfo._64_8_ =
       std::vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_>::size
                 (*(vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_> **)(in_RDX + 0x38)
                 );
  pvVar3 = std::vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_>::operator[]
                     (*(vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_> **)
                       (in_RDX + 0x38),_callInfo._64_8_ - 1);
  CallInfo::CallInfo((CallInfo *)local_70,pvVar3);
  std::__cxx11::ostringstream::ostringstream(local_1e8);
  poVar4 = std::operator<<((ostream *)local_1e8,"Msg Level  : ");
  tVar2 = toInteger<SLogLib::MessageLevel>(*(MessageLevel *)(in_RDX + 0x30));
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,tVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"Time       : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x20));
  poVar4 = std::operator<<(poVar4,"-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x22));
  poVar4 = std::operator<<(poVar4,"-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x26));
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x28));
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x2a));
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x2c));
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(ushort *)(in_RDX + 0x2e));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"Process ID : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDX + 0x40));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"Thread ID  : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDX + 0x44));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"FileName   : ");
  poVar4 = std::operator<<(poVar4,(string *)local_70);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"FuncName   : ");
  poVar4 = std::operator<<(poVar4,(string *)&_callInfo.field_0x18);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_1e8,"Line No.   : ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,_callInfo._56_4_);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)local_1e8,"CallStack  : ");
  _callInfo1.mLineNumber = 0;
  _callInfo1._68_4_ = 0;
  while( true ) {
    uVar1 = _callInfo1._64_8_;
    sVar5 = std::vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_>::size
                      (*(vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_> **)
                        (in_RDX + 0x38));
    if (sVar5 <= (ulong)uVar1) break;
    pvVar3 = std::vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_>::operator[]
                       (*(vector<SLogLib::CallInfo,_std::allocator<SLogLib::CallInfo>_> **)
                         (in_RDX + 0x38),_callInfo1._64_8_);
    CallInfo::CallInfo((CallInfo *)local_248,pvVar3);
    if (_callInfo1._64_8_ == 0) {
      std::operator<<((ostream *)local_1e8,(string *)local_248);
    }
    else {
      poVar4 = std::operator<<((ostream *)local_1e8,"             ");
      std::operator<<(poVar4,(string *)local_248);
    }
    poVar4 = std::operator<<((ostream *)local_1e8," : ");
    std::operator<<(poVar4,(string *)&_callInfo1.field_0x18);
    poVar4 = std::operator<<((ostream *)local_1e8," [");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,_callInfo1._56_4_);
    poVar4 = std::operator<<(poVar4,"]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    CallInfo::~CallInfo((CallInfo *)local_248);
    _callInfo1._64_8_ = _callInfo1._64_8_ + 1;
  }
  poVar4 = std::operator<<((ostream *)local_1e8,"Message    : ");
  poVar4 = std::operator<<(poVar4,in_RDX);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1e8);
  CallInfo::~CallInfo((CallInfo *)local_70);
  return this;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		size_t         _size     = msg.mCallStack->size();
		const CallInfo _callInfo = (*msg.mCallStack)[_size-1];
		
		std::ostringstream _stream;
		_stream << "Msg Level  : " << toInteger(msg.mLevel)       << std::endl;
		_stream << "Time       : " << msg.mDateTime.mYear         << "-"
								   << msg.mDateTime.mMonth        << "-"
								   << msg.mDateTime.mDay          << " "
								   << msg.mDateTime.mHour         << ":"
								   << msg.mDateTime.mMinute       << ":"
								   << msg.mDateTime.mSecond       << ":"
								   << msg.mDateTime.mMilliseconds << std::endl;
		_stream << "Process ID : " << msg.mProcessId              << std::endl;
		_stream << "Thread ID  : " << msg.mThreadId               << std::endl;
		_stream << "FileName   : " << _callInfo.mFileName         << std::endl;
		_stream << "FuncName   : " << _callInfo.mFuncName         << std::endl;
		_stream << "Line No.   : " << _callInfo.mLineNumber       << std::endl;
		_stream << "CallStack  : ";
		
		for(size_t i=0 ; i<msg.mCallStack->size() ; ++i)
		{
			const CallInfo _callInfo1 = (*msg.mCallStack)[i];
			
			if(i==0)
			{
				_stream << _callInfo1.mFileName;
			}
			else
			{
				_stream << "             " << _callInfo1.mFileName;
			}
			_stream << " : " << _callInfo1.mFuncName;
			_stream << " [" << _callInfo1.mLineNumber << "]" << std::endl;
		}
		
		_stream << "Message    : " << msg.mUserMessage << std::endl << std::endl;
		return _stream.str();
	}